

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O3

EventInfo * __thiscall
C3DFile::getEventInfo(EventInfo *__return_storage_ptr__,C3DFile *this,size_t index)

{
  undefined8 uVar1;
  byte bVar2;
  size_t sVar3;
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  ulong uVar4;
  ulong uVar5;
  string label;
  string context;
  ParameterInfo labels_info;
  ParameterInfo times_info;
  ParameterInfo contexts_info;
  long *local_160 [2];
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  undefined1 *local_120 [2];
  long local_110;
  byte *local_108;
  char *local_100;
  undefined1 *local_d0 [2];
  long local_c0;
  byte *local_b8;
  float *local_a0;
  ParameterInfo local_80;
  
  sVar3 = getEventCount(this);
  if (index < sVar3) {
    EventInfo::EventInfo(__return_storage_ptr__);
    getParamInfo(&local_80,this,"EVENT:CONTEXTS");
    bVar2 = local_80.dimensions[1];
    uVar5 = (ulong)*local_80.dimensions;
    __dest = operator_new__(bVar2 * uVar5);
    memcpy(__dest,local_80.char_data,bVar2 * uVar5);
    local_140[0] = local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        std::__cxx11::string::push_back((char)local_140);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    std::__cxx11::string::find_last_not_of((char)local_140,0x20);
    std::__cxx11::string::substr((ulong)local_120,(ulong)local_140);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->context,(string *)local_120);
    if ((Sint16 *)local_120[0] != &((ParameterInfo *)local_120)->next_offset) {
      operator_delete(local_120[0],local_110 + 1);
    }
    getParamInfo((ParameterInfo *)local_120,this,"EVENT:LABELS");
    bVar2 = local_108[1];
    uVar5 = (ulong)*local_108;
    __dest_00 = operator_new__(bVar2 * uVar5);
    memcpy(__dest_00,local_100,bVar2 * uVar5);
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"");
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        std::__cxx11::string::push_back((char)local_160);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    std::__cxx11::string::find_last_not_of((char)local_160,0x20);
    std::__cxx11::string::substr((ulong)local_d0,(ulong)local_160);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_d0);
    if ((Sint16 *)local_d0[0] != &((ParameterInfo *)local_d0)->next_offset) {
      operator_delete(local_d0[0],local_c0 + 1);
    }
    getParamInfo((ParameterInfo *)local_d0,this,"EVENT:TIMES");
    bVar2 = *local_b8;
    uVar5 = (ulong)((uint)local_b8[1] * (uint)bVar2 * 4);
    __dest_01 = operator_new__(uVar5);
    memcpy(__dest_01,local_a0,uVar5);
    uVar1 = *(undefined8 *)((long)__dest_01 + (index & 0xffffffff) * (ulong)bVar2 * 4);
    __return_storage_ptr__->time_minutes = (float)(int)uVar1;
    __return_storage_ptr__->time_seconds = (float)(int)((ulong)uVar1 >> 0x20);
    operator_delete__(__dest_01);
    ParameterInfo::~ParameterInfo((ParameterInfo *)local_d0);
    if (local_160[0] != local_150) {
      operator_delete(local_160[0],local_150[0] + 1);
    }
    operator_delete__(__dest_00);
    ParameterInfo::~ParameterInfo((ParameterInfo *)local_120);
    if (local_140[0] != local_130) {
      operator_delete(local_140[0],local_130[0] + 1);
    }
    operator_delete__(__dest);
    ParameterInfo::~ParameterInfo(&local_80);
    return __return_storage_ptr__;
  }
  __assert_fail("getEventCount() > index",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x3d,"EventInfo C3DFile::getEventInfo(size_t)");
}

Assistant:

EventInfo C3DFile::getEventInfo (size_t index) {
	assert (getEventCount() > index);

	EventInfo result;

	ParameterInfo contexts_info = getParamInfo ("EVENT:CONTEXTS");
	DataMatrix<char> contexts_data (
			static_cast<unsigned int>(contexts_info.dimensions[1]),
			static_cast<unsigned int>(contexts_info.dimensions[0])
			);

	contexts_data.CopyFrom (contexts_info.char_data);
	string context = "";
	for (size_t j = 0; j < contexts_data.GetColumns(); j++) {
		context += contexts_data(index, j);
	}
	result.context = context.substr (0, context.find_last_not_of(' ') + 1);

	ParameterInfo labels_info = getParamInfo ("EVENT:LABELS");
	DataMatrix<char> labels_data (
			static_cast<unsigned int>(labels_info.dimensions[1]),
			static_cast<unsigned int>(labels_info.dimensions[0])
			);

	labels_data.CopyFrom (labels_info.char_data);
	string label = "";
	for (size_t j = 0; j < labels_data.GetColumns(); j++) {
		label += labels_data(index, j);
	}
	result.label = label.substr (0, label.find_last_not_of(' ') + 1);

	ParameterInfo times_info = getParamInfo ("EVENT:TIMES");
	DataMatrix<float> times_data (
			static_cast<unsigned int>(times_info.dimensions[1]),
			static_cast<unsigned int>(times_info.dimensions[0])
			);

	times_data.CopyFrom (times_info.float_data);
	result.time_minutes = times_data(index, 0);
	result.time_seconds = times_data(index, 1);

	return result;
}